

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcLaborResource::IfcLaborResource(IfcLaborResource *this)

{
  *(undefined ***)&this->field_0x1b0 = &PTR__Object_007e6a70;
  *(undefined8 *)&this->field_0x1b8 = 0;
  *(char **)&this->field_0x1c0 = "IfcLaborResource";
  IfcConstructionResource::IfcConstructionResource
            (&this->super_IfcConstructionResource,&PTR_construction_vtable_24__00812c78);
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x180 = 0;
  *(undefined8 *)&this->super_IfcConstructionResource = 0x812b70;
  *(undefined8 *)&this->field_0x1b0 = 0x812c60;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x88 = 0x812b98;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x98 = 0x812bc0;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0xd0 = 0x812be8;
  (this->super_IfcConstructionResource).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>._vptr_ObjectHelper =
       (_func_int **)0x812c10;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x178 = 0x812c38;
  *(undefined1 **)&(this->super_IfcConstructionResource).field_0x188 = &this->field_0x198;
  *(undefined8 *)&this->field_0x190 = 0;
  this->field_0x198 = 0;
  this->field_0x1a8 = 0;
  return;
}

Assistant:

IfcLaborResource() : Object("IfcLaborResource") {}